

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteCnf.c
# Opt level: O3

void Io_WriteCnfOutputPiMapping(FILE *pFile,int incrementVars)

{
  Abc_Ntk_t *pAVar1;
  Vec_Int_t *__ptr;
  Vec_Ptr_t *pVVar2;
  char *pcVar3;
  long lVar4;
  
  pAVar1 = s_pNtk;
  __ptr = Abc_NtkGetCiSatVarNums(s_pNtk);
  fwrite("c PI variable numbers: <PI_name> <SAT_var_number>\n",0x32,1,(FILE *)pFile);
  pVVar2 = pAVar1->vCis;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      pcVar3 = Abc_ObjName((Abc_Obj_t *)pVVar2->pArray[lVar4]);
      if (__ptr->nSize <= lVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      fprintf((FILE *)pFile,"c %s %d\n",pcVar3,
              (ulong)(__ptr->pArray[lVar4] + (uint)(0 < incrementVars)));
      lVar4 = lVar4 + 1;
      pVVar2 = pAVar1->vCis;
    } while (lVar4 < pVVar2->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Io_WriteCnfOutputPiMapping( FILE * pFile, int incrementVars )
{
    extern Vec_Int_t * Abc_NtkGetCiSatVarNums( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk = s_pNtk;
    Vec_Int_t * vCiIds;
    Abc_Obj_t * pObj;
    int i;
    vCiIds = Abc_NtkGetCiSatVarNums( pNtk );
    fprintf( pFile, "c PI variable numbers: <PI_name> <SAT_var_number>\n" );
    Abc_NtkForEachCi( pNtk, pObj, i )
        fprintf( pFile, "c %s %d\n", Abc_ObjName(pObj), Vec_IntEntry(vCiIds, i) + (int)(incrementVars > 0) );
    Vec_IntFree( vCiIds );
}